

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall CTPNSym::gen_code_addr(CTPNSym *this)

{
  CTcPrsSymtab *this_00;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  this_00 = G_prs->global_symtab_;
  iVar1 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xc])();
  iVar2 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xd])(this);
  pCVar3 = CTcPrsSymtab::find_or_def
                     (this_00,(textchar_t *)CONCAT44(extraout_var,iVar1),
                      CONCAT44(extraout_var_00,iVar2),0,TCPRS_UNDEF_ADD_PROP_NO_WARNING);
  (*(pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x1a])
            (pCVar3);
  return;
}

Assistant:

void CTPNSym::gen_code_addr()
{
    /* 
     *   Look up our symbol in the global symbol table, then ask the
     *   resulting symbol to generate the appropriate code.  If the symbol
     *   isn't defined, assume it's a property.
     *   
     *   Note that we look only in the global symbol table, because local
     *   symbols have no address value.  So, even if the symbol is defined in
     *   the local table, ignore the local definition and look at the global
     *   definition.  
     */
    G_prs->get_global_symtab()
        ->find_or_def_prop_explicit(get_sym_text(), get_sym_text_len(),
                                    FALSE)
        ->gen_code_addr();
}